

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O0

inode_type_counter_array * __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
get_growing_inode_counts
          (inode_type_counter_array *__return_storage_ptr__,
          mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex);
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_growing_inode_counts
            (__return_storage_ptr__,&this->db_);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] auto get_growing_inode_counts() const {
    const std::lock_guard guard{mutex};
    return db_.get_growing_inode_counts();
  }